

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void event_roll_call(tgestate_t *state)

{
  byte bVar1;
  tgestate_t *in_RDI;
  vischar_t *vischar;
  uint8_t coord;
  uint8_t iters;
  uint8_t *pcoord;
  uint16_t range;
  vischar_t *local_28;
  char local_19;
  
  bVar1 = (in_RDI->hero_mappos).u;
  if ((((bVar1 < 0x72) || (0x7b < bVar1)) || (bVar1 = (in_RDI->hero_mappos).v, bVar1 < 0x6a)) ||
     (0x71 < bVar1)) {
    in_RDI->bell = '\0';
    queue_message(in_RDI,message_MISSED_ROLL_CALL);
    hostiles_pursue(in_RDI);
  }
  else {
    local_28 = in_RDI->vischars;
    local_19 = '\b';
    do {
      local_28->input = 0x80;
      local_28->direction = '\x03';
      local_28 = local_28 + 1;
      local_19 = local_19 + -1;
    } while (local_19 != '\0');
  }
  return;
}

Assistant:

void event_roll_call(tgestate_t *state)
{
  uint16_t   range;   /* was DE */ // pos8_t?
  uint8_t   *pcoord;  /* was HL */
  uint8_t    iters;   /* was B */
  uint8_t    coord;   /* was A */
  vischar_t *vischar; /* was HL */

  assert(state != NULL);

  /* Is the hero within the roll call area bounds? */
  /* Conv: Unrolled. */
  /* Range checking. X in (114..124) and Y in (106..114). */
  range = map_ROLL_CALL_X;
  pcoord = &state->hero_mappos.u;
  coord = *pcoord++;
  if (coord < ((range >> 8) & 0xFF) || coord >= ((range >> 0) & 0xFF))
    goto not_at_roll_call;

  range = map_ROLL_CALL_Y;
  coord = *pcoord++; // -> state->hero_map_position.y
  if (coord < ((range >> 8) & 0xFF) || coord >= ((range >> 0) & 0xFF))
    goto not_at_roll_call;

  /* All visible characters turn forward. */
  vischar = &state->vischars[0];
  iters = vischars_LENGTH;
  do
  {
    vischar->input = input_KICK;
    vischar->direction = direction_BOTTOM_LEFT;
    vischar++;
  }
  while (--iters);

  return;

not_at_roll_call:
  state->bell = bell_RING_PERPETUAL;
  queue_message(state, message_MISSED_ROLL_CALL);
  hostiles_pursue(state); /* was tail call */
}